

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManPrintOne(FILE *pFile,If_DsdMan_t *p,int iObjId,uchar *pPermLits,int fNewLine)

{
  Vec_Ptr_t *p_00;
  uint in_EAX;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uStack_38;
  int nSupp;
  
  uStack_38 = (ulong)in_EAX;
  fprintf((FILE *)pFile,"%6d : ");
  p_00 = &p->vObjs;
  uVar1 = If_DsdVecObjSuppSize(p_00,iObjId);
  fprintf((FILE *)pFile,"%2d ",(ulong)uVar1);
  uVar1 = If_DsdVecObjRef(p_00,iObjId);
  fprintf((FILE *)pFile,"%8d ",(ulong)uVar1);
  uVar1 = If_DsdVecObjMark(p_00,iObjId);
  fprintf((FILE *)pFile,"%d  ",(ulong)uVar1);
  iVar2 = Abc_Var2Lit(iObjId,0);
  If_DsdManPrint_rec(pFile,p,iVar2,pPermLits,&nSupp);
  if (fNewLine != 0) {
    fputc(10,(FILE *)pFile);
  }
  iVar2 = nSupp;
  iVar3 = If_DsdVecObjSuppSize(p_00,iObjId);
  if (iVar2 == iVar3) {
    return;
  }
  __assert_fail("nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x207,"void If_DsdManPrintOne(FILE *, If_DsdMan_t *, int, unsigned char *, int)");
}

Assistant:

void If_DsdManPrintOne( FILE * pFile, If_DsdMan_t * p, int iObjId, unsigned char * pPermLits, int fNewLine )
{
    int nSupp = 0;
    fprintf( pFile, "%6d : ", iObjId );
    fprintf( pFile, "%2d ",   If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
    fprintf( pFile, "%8d ",   If_DsdVecObjRef(&p->vObjs, iObjId) );
    fprintf( pFile, "%d  ",    If_DsdVecObjMark(&p->vObjs, iObjId) );
    If_DsdManPrint_rec( pFile, p, Abc_Var2Lit(iObjId, 0), pPermLits, &nSupp );
    if ( fNewLine )
        fprintf( pFile, "\n" );
    assert( nSupp == If_DsdVecObjSuppSize(&p->vObjs, iObjId) );
}